

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

void enet_peer_reset_outgoing_commands(ENetList *queue)

{
  uint32_t *puVar1;
  _ENetListNode *p_Var2;
  _ENetListNode *p_Var3;
  _ENetListNode *p_Var4;
  ENetPacket *packet;
  
  while (p_Var2 = (queue->sentinel).next, p_Var2 != &queue->sentinel) {
    p_Var3 = ((ENetListNode *)&p_Var2->next)->next;
    p_Var4 = p_Var2->previous;
    p_Var4->next = p_Var3;
    p_Var3->previous = p_Var4;
    packet = (ENetPacket *)p_Var2[5].previous;
    if (packet != (ENetPacket *)0x0) {
      puVar1 = &packet->referenceCount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        enet_packet_destroy(packet);
      }
    }
    (*(code *)callbacks_1)(p_Var2);
  }
  return;
}

Assistant:

static void enet_peer_reset_outgoing_commands(ENetList* queue) {
	ENetOutgoingCommand* outgoingCommand;

	while (!enet_list_empty(queue)) {
		outgoingCommand = (ENetOutgoingCommand*)enet_list_remove(enet_list_begin(queue));

		if (outgoingCommand->packet != NULL) {
			--outgoingCommand->packet->referenceCount;

			if (outgoingCommand->packet->referenceCount == 0)
				enet_packet_destroy(outgoingCommand->packet);
		}

		enet_free(outgoingCommand);
	}
}